

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

void __thiscall argo::token::token(token *this,token *other)

{
  token *other_local;
  token *this_local;
  
  this->_vptr_token = (_func_int **)&PTR__token_00132d60;
  std::__cxx11::string::string((string *)&this->m_raw_value);
  operator=(this,other);
  return;
}

Assistant:

token::token(token &&other)
{
    *this = other;
}